

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::internal::basic_buffer<char>::append<char>(basic_buffer<char> *this,char *begin,char *end)

{
  size_t sVar1;
  type tVar2;
  ulong uVar3;
  ptrdiff_t _Num;
  
  sVar1 = this->size_;
  tVar2 = to_unsigned<long>((long)end - (long)begin);
  uVar3 = tVar2 + sVar1;
  if (this->capacity_ < uVar3) {
    (**this->_vptr_basic_buffer)(this,uVar3);
  }
  if (end != begin) {
    memmove(this->ptr_ + this->size_,begin,(long)end - (long)begin);
  }
  this->size_ = uVar3;
  return;
}

Assistant:

void basic_buffer<T>::append(const U *begin, const U *end) {
  std::size_t new_size = size_ + internal::to_unsigned(end - begin);
  reserve(new_size);
  std::uninitialized_copy(begin, end,
                          internal::make_checked(ptr_, capacity_) + size_);
  size_ = new_size;
}